

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

shared_ptr<minja::Value> __thiscall minja::Parser::parseConstant(Parser *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  reference pcVar4;
  ulong uVar5;
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<minja::Value> sVar7;
  json number;
  string token;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str;
  CharIterator start;
  CharIterator *in_stack_000000c0;
  Parser *in_stack_000000c8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff74;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  string local_50 [28];
  SpaceHandling in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar8;
  undefined4 in_stack_ffffffffffffffd4;
  Parser *in_stack_ffffffffffffffd8;
  
  uVar1 = *(undefined8 *)(in_RSI + 0x20);
  consumeSpaces((Parser *)in_RDI,(SpaceHandling)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  bVar2 = __gnu_cxx::operator==
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if (bVar2) {
    std::shared_ptr<minja::Value>::shared_ptr
              ((shared_ptr<minja::Value> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    _Var6._M_pi = extraout_RDX;
  }
  else {
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(in_RSI + 0x20));
    if ((*pcVar4 == '\"') ||
       (pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)(in_RSI + 0x20)), *pcVar4 == '\'')) {
      parseString_abi_cxx11_((Parser *)in_RDI);
      bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)0x3146d4);
      if (bVar2) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator*((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffff40);
        std::make_shared<minja::Value,std::__cxx11::string&>(in_stack_ffffffffffffff68);
      }
      uVar8 = (uint)bVar2;
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffff40);
      _Var6._M_pi = extraout_RDX_00;
      if (uVar8 != 0) goto LAB_00314a6d;
      in_stack_ffffffffffffffd0 = 0;
    }
    if ((parseConstant()::prim_tok_abi_cxx11_ == '\0') &&
       (iVar3 = __cxa_guard_acquire(&parseConstant()::prim_tok_abi_cxx11_), iVar3 != 0)) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_ffffffffffffff80,
                 (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                 in_stack_ffffffffffffff74);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseConstant()::prim_tok_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseConstant()::prim_tok_abi_cxx11_);
    }
    consumeToken(in_stack_ffffffffffffffd8,
                 (regex *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      bVar2 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      if ((bVar2) ||
         (bVar2 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38),
         bVar2)) {
        std::make_shared<minja::Value,bool>((bool *)in_stack_ffffffffffffff68);
      }
      else {
        bVar2 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
        if ((bVar2) ||
           (bVar2 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38),
           bVar2)) {
          std::make_shared<minja::Value,bool>((bool *)in_stack_ffffffffffffff68);
        }
        else {
          bVar2 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
          if (!bVar2) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
            std::runtime_error::runtime_error(this_00,(string *)&stack0xffffffffffffff80);
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::make_shared<minja::Value,decltype(nullptr)>((void **)in_stack_ffffffffffffff68);
        }
      }
    }
    else {
      parseNumber(in_stack_000000c8,in_stack_000000c0,(CharIterator *)this);
      bVar2 = nlohmann::json_abi_v3_11_3::
              basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::is_null((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)&stack0xffffffffffffff68);
      if (bVar2) {
        *(undefined8 *)(in_RSI + 0x20) = uVar1;
        std::shared_ptr<minja::Value>::shared_ptr
                  ((shared_ptr<minja::Value> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      }
      else {
        std::
        make_shared<minja::Value,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&>
                  ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_ffffffffffffff68);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_ffffffffffffff40);
    }
    std::__cxx11::string::~string(local_50);
    _Var6._M_pi = extraout_RDX_01;
  }
LAB_00314a6d:
  sVar7.super___shared_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi
  ;
  sVar7.super___shared_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<minja::Value>)
         sVar7.super___shared_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Value> parseConstant() {
      auto start = it;
      consumeSpaces();
      if (it == end) return nullptr;
      if (*it == '"' || *it == '\'') {
        auto str = parseString();
        if (str) return std::make_shared<Value>(*str);
      }
      static std::regex prim_tok(R"(true\b|True\b|false\b|False\b|None\b)");
      auto token = consumeToken(prim_tok);
      if (!token.empty()) {
        if (token == "true" || token == "True") return std::make_shared<Value>(true);
        if (token == "false" || token == "False") return std::make_shared<Value>(false);
        if (token == "None") return std::make_shared<Value>(nullptr);
        throw std::runtime_error("Unknown constant token: " + token);
      }

      auto number = parseNumber(it, end);
      if (!number.is_null()) return std::make_shared<Value>(number);

      it = start;
      return nullptr;
    }